

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<long_double>,void,void,void,void,void,void,void,void,void>,std::tr1::tuple<long_double,void,void,void,void,void,void,void,void,void>>
               (tuple<testing::Matcher<long_double>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
                *matchers,
               tuple<long_double,_void,_void,_void,_void,_void,_void,_void,_void,_void> *values,
               ostream *os)

{
  bool bVar1;
  type plVar2;
  ostream *poVar3;
  ostream *in_RDX;
  tuple<long_double,_void,_void,_void,_void,_void,_void,_void,_void,_void> *in_RSI;
  tuple<testing::Matcher<long_double>,_void,_void,_void,_void,_void,_void,_void,_void,_void> *in_RDI
  ;
  StringMatchResultListener listener;
  Value value;
  type matcher;
  Matcher<long_double> *in_stack_fffffffffffffdb8;
  StringMatchResultListener *this;
  undefined2 in_stack_fffffffffffffdc0;
  undefined2 uVar4;
  undefined6 in_stack_fffffffffffffdc2;
  MatchResultListener *in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  undefined2 in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  string local_210 [456];
  longdouble local_48;
  ostream *local_18;
  
  local_18 = in_RDX;
  TuplePrefix<0ul>::
  ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<long_double>,void,void,void,void,void,void,void,void,void>,std::tr1::tuple<long_double,void,void,void,void,void,void,void,void,void>>
            (in_RDI,in_RSI,in_RDX);
  std::tr1::get<0,testing::Matcher<long_double>,void,void,void,void,void,void,void,void,void>
            ((tuple<testing::Matcher<long_double>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
              *)0x165419);
  Matcher<long_double>::Matcher
            ((Matcher<long_double> *)CONCAT62(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdb8);
  plVar2 = std::tr1::get<0,long_double,void,void,void,void,void,void,void,void,void>
                     ((tuple<long_double,_void,_void,_void,_void,_void,_void,_void,_void,_void> *)
                      0x165436);
  local_48 = *plVar2;
  StringMatchResultListener::StringMatchResultListener
            ((StringMatchResultListener *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  this = SUB108(local_48,0);
  uVar4 = (undefined2)((unkuint10)local_48 >> 0x40);
  bVar1 = MatcherBase<long_double>::MatchAndExplain
                    ((MatcherBase<long_double> *)
                     CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                     (longdouble)CONCAT28(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0),
                     in_stack_fffffffffffffdc8);
  if (!bVar1) {
    poVar3 = std::operator<<(local_18,"  Expected arg #");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
    std::operator<<(poVar3,": ");
    std::tr1::get<0,testing::Matcher<long_double>,void,void,void,void,void,void,void,void,void>
              ((tuple<testing::Matcher<long_double>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
                *)0x1654d9);
    MatcherBase<long_double>::DescribeTo
              ((MatcherBase<long_double> *)CONCAT62(in_stack_fffffffffffffdc2,uVar4),(ostream *)this
              );
    std::operator<<(local_18,"\n           Actual: ");
    UniversalPrint<long_double>
              ((longdouble *)CONCAT62(in_stack_fffffffffffffdc2,uVar4),(ostream *)this);
    StringMatchResultListener::str_abi_cxx11_(this);
    PrintIfNotEmpty((string *)CONCAT62(in_stack_fffffffffffffdc2,uVar4),(ostream *)this);
    std::__cxx11::string::~string(local_210);
    std::operator<<(local_18,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener
            ((StringMatchResultListener *)CONCAT62(in_stack_fffffffffffffdc2,uVar4));
  Matcher<long_double>::~Matcher((Matcher<long_double> *)0x1655cb);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }